

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O1

int ssl_load_session(mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  bool bVar1;
  int iVar2;
  mbedtls_x509_crt *crt;
  int iVar3;
  ulong buflen;
  uchar *buf_00;
  uchar *puVar4;
  
  iVar3 = -0x7100;
  if ((long)len < 0x98) {
    return -0x7100;
  }
  memcpy(session,buf,0x98);
  if ((long)len < 0x9b) {
    return -0x7100;
  }
  buf_00 = buf + 0x9b;
  buflen = (ulong)buf[0x9a] | (ulong)((uint)buf[0x99] << 8 | (uint)buf[0x98] << 0x10);
  if (buflen == 0) {
    session->peer_cert = (mbedtls_x509_crt *)0x0;
    goto LAB_00119811;
  }
  puVar4 = buf_00 + buflen;
  if (buf + len < puVar4) {
    iVar2 = -0x7100;
LAB_0011980b:
    bVar1 = false;
    puVar4 = buf_00;
    iVar3 = iVar2;
  }
  else {
    crt = (mbedtls_x509_crt *)calloc(1,0x228);
    session->peer_cert = crt;
    if (crt == (mbedtls_x509_crt *)0x0) {
      iVar2 = -0x7f00;
      goto LAB_0011980b;
    }
    mbedtls_x509_crt_init(crt);
    iVar2 = mbedtls_x509_crt_parse_der(session->peer_cert,buf_00,buflen);
    if (iVar2 != 0) {
      mbedtls_x509_crt_free(session->peer_cert);
      free(session->peer_cert);
      session->peer_cert = (mbedtls_x509_crt *)0x0;
      goto LAB_0011980b;
    }
    bVar1 = true;
  }
  buf_00 = puVar4;
  if (!bVar1) {
    return iVar3;
  }
LAB_00119811:
  iVar3 = -0x7100;
  if (buf_00 == buf + len) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int ssl_load_session( mbedtls_ssl_session *session,
                             const unsigned char *buf, size_t len )
{
    const unsigned char *p = buf;
    const unsigned char * const end = buf + len;
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    size_t cert_len;
#endif /* MBEDTLS_X509_CRT_PARSE_C */

    if( p + sizeof( mbedtls_ssl_session ) > end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    memcpy( session, p, sizeof( mbedtls_ssl_session ) );
    p += sizeof( mbedtls_ssl_session );

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( p + 3 > end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    cert_len = ( p[0] << 16 ) | ( p[1] << 8 ) | p[2];
    p += 3;

    if( cert_len == 0 )
    {
        session->peer_cert = NULL;
    }
    else
    {
        int ret;

        if( p + cert_len > end )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        session->peer_cert = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( session->peer_cert == NULL )
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

        mbedtls_x509_crt_init( session->peer_cert );

        if( ( ret = mbedtls_x509_crt_parse_der( session->peer_cert,
                                        p, cert_len ) ) != 0 )
        {
            mbedtls_x509_crt_free( session->peer_cert );
            mbedtls_free( session->peer_cert );
            session->peer_cert = NULL;
            return( ret );
        }

        p += cert_len;
    }
#endif /* MBEDTLS_X509_CRT_PARSE_C */

    if( p != end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    return( 0 );
}